

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

double __thiscall lda::lgamma(lda *this,double param_1)

{
  lda_math_mode lVar1;
  ostream *poVar2;
  float fVar3;
  type tVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float x;
  undefined8 uStack_8;
  
  fVar3 = SUB84(param_1,0);
  lVar1 = this->mmode;
  uStack_8 = (ulong)lVar1;
  if (lVar1 == USE_SIMD) {
    uStack_8 = (ulong)param_1 & 0xffffffff;
    fVar3 = ldamath::fastlog((fVar3 + 2.0) * (fVar3 + 1.0) * fVar3);
    x = (float)uStack_8 + 3.0;
    uStack_8._4_4_ = (0.0833333 / x + (-2.0810614 - (float)uStack_8)) - fVar3;
    uStack_8._0_4_ = (float)uStack_8 + 2.5;
    fVar3 = ldamath::fastlog(x);
    return (double)CONCAT44(extraout_XMM0_Db_00,fVar3 * (float)uStack_8 + uStack_8._4_4_);
  }
  if (lVar1 != USE_PRECISE) {
    if (lVar1 == USE_FAST_APPROX) {
      fVar3 = ldamath::fastlgamma(fVar3);
      return (double)CONCAT44(extraout_XMM0_Db,fVar3);
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "lda::lgamma: Trampled or invalid math mode, aborting");
    std::endl<char,std::char_traits<char>>(poVar2);
    abort();
  }
  tVar4 = boost::math::
          lgamma<float,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    (fVar3,(int *)0x0,
                     (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)((long)&uStack_8 + 7));
  return (double)CONCAT44(extraout_XMM0_Db_01,tVar4);
}

Assistant:

float lda::lgamma(float x)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      // std::cerr << "lda::lgamma FAST_APPROX ";
      return ldamath::lgamma<float, USE_FAST_APPROX>(x);
    case USE_PRECISE:
      // std::cerr << "lda::lgamma PRECISE ";
      return ldamath::lgamma<float, USE_PRECISE>(x);
    case USE_SIMD:
      // std::cerr << "lda::gamma SIMD ";
      return ldamath::lgamma<float, USE_SIMD>(x);
    default:
      std::cerr << "lda::lgamma: Trampled or invalid math mode, aborting" << std::endl;
      abort();
      return 0.0f;
  }
}